

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetectorTest.cpp
# Opt level: O0

void __thiscall
TEST_MemoryLeakDetectorTest_OneLeakUsingOperatorNewWithFileLine_Test::testBody
          (TEST_MemoryLeakDetectorTest_OneLeakUsingOperatorNewWithFileLine_Test *this)

{
  MemoryLeakDetector *this_00;
  bool bVar1;
  TestMemoryAllocator *allocator;
  char *otherBuffer;
  UtestShell *pUVar2;
  TestTerminator *pTVar3;
  SimpleString local_58;
  SimpleString local_48 [2];
  undefined1 local_28 [8];
  SimpleString output;
  char *mem;
  TEST_MemoryLeakDetectorTest_OneLeakUsingOperatorNewWithFileLine_Test *this_local;
  
  this_00 = (this->super_TEST_GROUP_CppUTestGroupMemoryLeakDetectorTest).detector;
  allocator = defaultNewAllocator();
  output.bufferSize_ =
       (size_t)MemoryLeakDetector::allocMemory(this_00,allocator,4,"file.cpp",0x4d2,false);
  MemoryLeakDetector::stopChecking
            ((this->super_TEST_GROUP_CppUTestGroupMemoryLeakDetectorTest).detector);
  otherBuffer = MemoryLeakDetector::report
                          ((this->super_TEST_GROUP_CppUTestGroupMemoryLeakDetectorTest).detector,
                           mem_leak_period_checking);
  SimpleString::SimpleString((SimpleString *)local_28,otherBuffer);
  pUVar2 = UtestShell::getCurrent();
  SimpleString::SimpleString(local_48,"file.cpp");
  bVar1 = SimpleString::contains((SimpleString *)local_28,local_48);
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar2->_vptr_UtestShell[8])
            (pUVar2,(ulong)bVar1,"CHECK","output.contains(\"file.cpp\")",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakDetectorTest.cpp"
             ,0x13f,pTVar3);
  SimpleString::~SimpleString(local_48);
  pUVar2 = UtestShell::getCurrent();
  SimpleString::SimpleString(&local_58,"1234");
  bVar1 = SimpleString::contains((SimpleString *)local_28,&local_58);
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar2->_vptr_UtestShell[8])
            (pUVar2,(ulong)bVar1,"CHECK","output.contains(\"1234\")",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakDetectorTest.cpp"
             ,0x140,pTVar3);
  SimpleString::~SimpleString(&local_58);
  (*PlatformSpecificFree)((void *)output.bufferSize_);
  SimpleString::~SimpleString((SimpleString *)local_28);
  return;
}

Assistant:

TEST(MemoryLeakDetectorTest, OneLeakUsingOperatorNewWithFileLine)
{
    char* mem = detector->allocMemory(defaultNewAllocator(), 4, "file.cpp", 1234);
    detector->stopChecking();
    SimpleString output = detector->report(mem_leak_period_checking);
    CHECK(output.contains("file.cpp"));
    CHECK(output.contains("1234"));
    PlatformSpecificFree(mem);
}